

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cc
# Opt level: O0

double __thiscall calculator::ExpressionTree::calcValue(ExpressionTree *this,node *x)

{
  node *x_00;
  node *y;
  Integer IVar1;
  ExpressionTree *pEVar2;
  node *local_a8;
  string local_98;
  double val_1;
  string local_60;
  double val;
  node *valid_child;
  double r;
  double l;
  node *x_local;
  ExpressionTree *this_local;
  
  if (x == (node *)0x0) {
    this_local = (ExpressionTree *)0x0;
  }
  else {
    l = (double)x;
    x_local = (node *)this;
    r = calcValue(this,x->left);
    if (*(long *)((long)l + 0x38) != 0) {
      *(double *)(*(long *)((long)l + 0x38) + 0x30) = r;
    }
    valid_child = (node *)calcValue(this,*(node **)((long)l + 0x40));
    if (*(long *)((long)l + 0x40) != 0) {
      *(node **)(*(long *)((long)l + 0x40) + 0x30) = valid_child;
    }
    if (*(long *)((long)l + 0x38) == 0) {
      local_a8 = *(node **)((long)l + 0x40);
    }
    else {
      local_a8 = *(node **)((long)l + 0x38);
    }
    val = (double)local_a8;
    if ((*(int *)l == 0) || (*(int *)l == 1)) {
      this_local = *(ExpressionTree **)((long)l + 0x30);
    }
    else if (*(int *)l == 0x11) {
      std::__cxx11::string::string((string *)&local_60,(string *)((long)l + 8));
      pEVar2 = (ExpressionTree *)calcFunctionValue(this,local_a8,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      this_local = pEVar2;
      if ((*(byte *)((long)l + 0x28) & 1) != 0) {
        this_local = (ExpressionTree *)((ulong)pEVar2 ^ 0x8000000000000000);
      }
    }
    else if (*(int *)l == 0x12) {
      x_00 = *(node **)((long)l + 0x38);
      y = *(node **)((long)l + 0x40);
      std::__cxx11::string::string((string *)&local_98,(string *)((long)l + 8));
      pEVar2 = (ExpressionTree *)calcBinaryFunctionValuie(this,x_00,y,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      this_local = pEVar2;
      if ((*(byte *)((long)l + 0x28) & 1) != 0) {
        this_local = (ExpressionTree *)((ulong)pEVar2 ^ 0x8000000000000000);
      }
    }
    else if ((*(int *)l == 5) || (*(int *)l == 7)) {
      IVar1 = calcValue(this,local_a8,*(Tag *)l);
      this_local = (ExpressionTree *)(double)IVar1;
    }
    else {
      this_local = (ExpressionTree *)
                   calcValue(this,*(node **)((long)l + 0x38),*(node **)((long)l + 0x40),*(Tag *)l);
    }
  }
  return (double)this_local;
}

Assistant:

double ExpressionTree::calcValue(node *x) {
    if (!x) return 0.0;

    // 更新操作符节点中的值
    double l = calcValue(x->left);
    if (x->left) x->left->value = l;
    double r = calcValue(x->right);
    if (x->right) x->right->value = r;

    node *valid_child = x->left ? x->left : x->right;
    if (x->type == Tag::Number || x->type == Tag::Float) return x->value;

    // 计算一元函数
    else if (x->type == Tag::Function) {
        double val = calcFunctionValue(valid_child, x->funcname);
        if (x->negative) return -val;
        return val;
    }
    // 计算二元函数
    else if (x->type == Tag::BinaryFunction) {
        double val = calcBinaryFunctionValuie(x->left, x->right, x->funcname);
        if (x->negative) return -val;
        return val;
    }
    // 计算一元操作符
    else if (x->type == Tag::Not || x->type == Tag::Negate)
        return (double)calcValue(valid_child, x->type);
    // 根据当前节点的tag 从孩子节点计算值 并存储到当前节点的 node.value 中
    return calcValue(x->left, x->right, x->type);
}